

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nng.c
# Opt level: O1

int nng_socket_raw(nng_socket id,_Bool *rawp)

{
  _Bool _Var1;
  int iVar2;
  nni_sock *in_RAX;
  nni_sock *local_18;
  nni_sock *sock;
  
  local_18 = in_RAX;
  iVar2 = nni_sock_find(&local_18,id.id);
  if (iVar2 == 0) {
    _Var1 = nni_sock_raw(local_18);
    *rawp = _Var1;
    nni_sock_rele(local_18);
    iVar2 = 0;
  }
  return iVar2;
}

Assistant:

int
nng_socket_raw(nng_socket id, bool *rawp)
{
	int       rv;
	nni_sock *sock;

	if ((rv = nni_sock_find(&sock, id.id)) != 0) {
		return (rv);
	}
	*rawp = nni_sock_raw(sock);
	nni_sock_rele(sock);
	return (0);
}